

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr,int rHasNullFlag,int isRowid)

{
  byte *pbVar1;
  u8 uVar2;
  Select *pSVar3;
  ExprList *pEVar4;
  Vdbe *p;
  undefined1 uVar5;
  char cVar6;
  int iVar7;
  uint N;
  int iVar8;
  int iVar9;
  Expr *pEVar10;
  KeyInfo *zP4;
  CollSeq *pCVar11;
  Expr *pLeft;
  uint p2;
  char *pcVar12;
  ulong uVar13;
  Parse *pPVar14;
  Select **ppSVar15;
  int iVar16;
  ExprList_item *pEVar17;
  ulong uVar18;
  char local_91;
  Vdbe *local_90;
  Parse *local_88;
  Expr *local_80;
  int local_78;
  int local_74;
  Select **local_70;
  Expr *local_68;
  KeyInfo *local_60;
  int local_54;
  int iValToIns;
  int local_4c;
  undefined8 local_48;
  char *pcStack_40;
  
  local_74 = isRowid;
  local_90 = sqlite3GetVdbe(pParse);
  if (local_90 == (Vdbe *)0x0) {
LAB_00156192:
    iVar7 = 0;
  }
  else {
    pParse->iCacheLevel = pParse->iCacheLevel + 1;
    if ((pExpr->flags & 0x20) == 0) {
      iVar7 = sqlite3VdbeAddOp0(local_90,0x14);
    }
    else {
      iVar7 = -1;
    }
    if (pParse->explain == '\x02') {
      pcVar12 = "CORRELATED ";
      if (-1 < iVar7) {
        pcVar12 = "";
      }
      pcVar12 = sqlite3MPrintf(pParse->db,"EXECUTE %s%s SUBQUERY %d",pcVar12);
      sqlite3VdbeAddOp4(local_90,0xa7,pParse->iSelectId,0,0,pcVar12,-7);
    }
    uVar2 = pExpr->op;
    local_70 = (Select **)CONCAT44(local_70._4_4_,iVar7);
    local_88 = pParse;
    if (uVar2 == 'J') {
      local_68 = pExpr->pLeft;
      N = sqlite3ExprVectorSize(local_68);
      iVar16 = local_74;
      pPVar14 = local_88;
      iVar7 = local_88->nTab;
      local_88->nTab = iVar7 + 1;
      pExpr->iTable = iVar7;
      p2 = 0;
      if (local_74 == 0) {
        p2 = N;
      }
      local_54 = sqlite3VdbeAddOp2(local_90,0x6c,iVar7,p2);
      if (iVar16 == 0) {
        zP4 = sqlite3KeyInfoAlloc(pPVar14->db,N,1);
      }
      else {
        zP4 = (KeyInfo *)0x0;
      }
      pPVar14 = local_88;
      pSVar3 = (Select *)(pExpr->x).pList;
      local_80 = pExpr;
      if ((pExpr->flags & 0x800) == 0) {
        if (pSVar3 != (Select *)0x0) {
          cVar6 = sqlite3ExprAffinity(local_68);
          pPVar14 = local_88;
          local_91 = 'A';
          if (cVar6 != '\0') {
            local_91 = cVar6;
          }
          if (zP4 != (KeyInfo *)0x0) {
            pCVar11 = sqlite3ExprCollSeq(local_88,local_80->pLeft);
            zP4->aColl[0] = pCVar11;
          }
          local_78 = rHasNullFlag;
          local_60 = zP4;
          iVar7 = sqlite3GetTempReg(pPVar14);
          local_68 = (Expr *)CONCAT44(local_68._4_4_,iVar7);
          iVar7 = sqlite3GetTempReg(pPVar14);
          uVar13 = (ulong)local_70 & 0xffffffff;
          if (local_74 != 0) {
            sqlite3VdbeAddOp2(local_90,0x3b,0,iVar7);
          }
          ppSVar15 = (Select **)&pSVar3->op;
          for (iVar16 = *(int *)&pSVar3->pEList; pPVar14 = local_88, iVar9 = (int)uVar13, 0 < iVar16
              ; iVar16 = iVar16 + -1) {
            pSVar3 = *ppSVar15;
            if ((-1 < iVar9) && (iVar8 = sqlite3ExprIsConstant((Expr *)pSVar3), iVar8 == 0)) {
              sqlite3VdbeChangeToNoop(local_90,iVar9);
              uVar13 = 0xffffffffffffffff;
            }
            if ((local_74 == 0) ||
               (iVar9 = sqlite3ExprIsInteger((Expr *)pSVar3,&iValToIns), iVar9 == 0)) {
              pPVar14 = local_88;
              local_70 = ppSVar15;
              iVar9 = sqlite3ExprCodeTarget(local_88,(Expr *)pSVar3,(int)local_68);
              p = local_90;
              if (local_74 == 0) {
                sqlite3VdbeAddOp4(local_90,99,iVar9,1,iVar7,&local_91,1);
                sqlite3ExprCacheRemove(pPVar14,iVar9,1);
                sqlite3VdbeAddOp4Int(p,0x7e,local_80->iTable,iVar7,iVar9,1);
                ppSVar15 = local_70;
              }
              else {
                sqlite3VdbeAddOp2(local_90,0x11,iVar9,local_90->nOp + 2);
                sqlite3VdbeAddOp3(p,0x74,local_80->iTable,iVar7,iVar9);
                ppSVar15 = local_70;
              }
            }
            else {
              sqlite3VdbeAddOp3(local_90,0x75,local_80->iTable,iVar7,iValToIns);
            }
            ppSVar15 = ppSVar15 + 4;
          }
          local_70 = (Select **)CONCAT44(local_70._4_4_,iVar9);
          sqlite3ReleaseTempReg(local_88,(int)local_68);
          sqlite3ReleaseTempReg(pPVar14,iVar7);
          zP4 = local_60;
          pExpr = local_80;
          rHasNullFlag = local_78;
        }
      }
      else {
        pEVar4 = pSVar3->pEList;
        local_78 = rHasNullFlag;
        if (pEVar4->nExpr == N) {
          local_4c = pExpr->iTable;
          iValToIns = CONCAT31(iValToIns._1_3_,0xb);
          local_48._0_4_ = 0;
          local_48._4_4_ = 0;
          local_60 = zP4;
          pcStack_40 = exprINAffinity(local_88,pExpr);
          pSVar3->iLimit = 0;
          iVar7 = sqlite3Select(pPVar14,pSVar3,(SelectDest *)&iValToIns);
          sqlite3DbFree(pPVar14->db,pcStack_40);
          zP4 = local_60;
          pEVar10 = local_68;
          pExpr = local_80;
          if (iVar7 != 0) {
            sqlite3KeyInfoUnref(local_60);
            goto LAB_00156192;
          }
          pEVar17 = pEVar4->a;
          uVar18 = 0;
          uVar13 = (ulong)N;
          if ((int)N < 1) {
            uVar13 = uVar18;
          }
          for (; rHasNullFlag = local_78, uVar13 != uVar18; uVar18 = uVar18 + 1) {
            pLeft = sqlite3VectorFieldSubexpr(pEVar10,(int)uVar18);
            pCVar11 = sqlite3BinaryCompareCollSeq(local_88,pLeft,pEVar17->pExpr);
            zP4->aColl[uVar18] = pCVar11;
            pEVar17 = pEVar17 + 1;
          }
        }
      }
      iVar7 = 0;
      pPVar14 = local_88;
      if (zP4 != (KeyInfo *)0x0) {
        sqlite3VdbeChangeP4(local_90,local_54,(char *)zP4,-9);
        pPVar14 = local_88;
      }
    }
    else {
      pSVar3 = (pExpr->x).pSelect;
      if (uVar2 == 'w') {
        iVar7 = pSVar3->pEList->nExpr;
      }
      else {
        iVar7 = 1;
      }
      local_4c = pParse->nMem + 1;
      iVar16 = pParse->nMem + iVar7;
      local_48._0_4_ = 0;
      local_48._4_4_ = 0;
      pcStack_40 = (char *)0x0;
      pParse->nMem = iVar16;
      if (uVar2 == 'w') {
        local_48._4_4_ = iVar7;
        local_48._0_4_ = local_4c;
        sqlite3VdbeAddOp3(local_90,0x3b,0,local_4c,iVar16);
        uVar5 = 10;
      }
      else {
        sqlite3VdbeAddOp2(local_90,0x38,0,local_4c);
        uVar5 = 3;
      }
      pPVar14 = local_88;
      iValToIns = CONCAT31(iValToIns._1_3_,uVar5);
      sqlite3ExprDelete(local_88->db,pSVar3->pLimit);
      pEVar10 = sqlite3ExprAlloc(pPVar14->db,0x86,sqlite3IntTokens + 1,0);
      pSVar3->pLimit = pEVar10;
      pSVar3->iLimit = 0;
      pbVar1 = (byte *)((long)&pSVar3->selFlags + 1);
      *pbVar1 = *pbVar1 & 0xfb;
      iVar16 = sqlite3Select(pPVar14,pSVar3,(SelectDest *)&iValToIns);
      iVar7 = local_4c;
      if (iVar16 != 0) {
        return 0;
      }
    }
    if (rHasNullFlag != 0) {
      sqlite3SetHasNullFlag(local_90,pExpr->iTable,rHasNullFlag);
    }
    if (-1 < (int)local_70) {
      sqlite3VdbeJumpHere(local_90,(int)local_70);
    }
    sqlite3ExprCachePop(pPVar14);
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN, SELECT, or EXISTS operator */
  int rHasNullFlag,       /* Register that records whether NULLs exist in RHS */
  int isRowid             /* If true, LHS of IN operator is a rowid */
){
  int jmpIfDynamic = -1;                      /* One-time test address */
  int rReg = 0;                           /* Register storing resulting */
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return 0;
  sqlite3ExprCachePush(pParse);

  /* The evaluation of the IN/EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    jmpIfDynamic = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

#ifndef SQLITE_OMIT_EXPLAIN
  if( pParse->explain==2 ){
    char *zMsg = sqlite3MPrintf(pParse->db, "EXECUTE %s%s SUBQUERY %d",
        jmpIfDynamic>=0?"":"CORRELATED ",
        pExpr->op==TK_IN?"LIST":"SCALAR",
        pParse->iNextSelectId
    );
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
#endif

  switch( pExpr->op ){
    case TK_IN: {
      int addr;                   /* Address of OP_OpenEphemeral instruction */
      Expr *pLeft = pExpr->pLeft; /* the LHS of the IN operator */
      KeyInfo *pKeyInfo = 0;      /* Key information */
      int nVal;                   /* Size of vector pLeft */
      
      nVal = sqlite3ExprVectorSize(pLeft);
      assert( !isRowid || nVal==1 );

      /* Whether this is an 'x IN(SELECT...)' or an 'x IN(<exprlist>)'
      ** expression it is handled the same way.  An ephemeral table is 
      ** filled with index keys representing the results from the 
      ** SELECT or the <exprlist>.
      **
      ** If the 'x' expression is a column value, or the SELECT...
      ** statement returns a column value, then the affinity of that
      ** column is used to build the index keys. If both 'x' and the
      ** SELECT... statement are columns, then numeric affinity is used
      ** if either column has NUMERIC or INTEGER affinity. If neither
      ** 'x' nor the SELECT... statement are columns, then numeric affinity
      ** is used.
      */
      pExpr->iTable = pParse->nTab++;
      addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, 
          pExpr->iTable, (isRowid?0:nVal));
      pKeyInfo = isRowid ? 0 : sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* Case 1:     expr IN (SELECT ...)
        **
        ** Generate code to write the results of the select into the temporary
        ** table allocated and opened above.
        */
        Select *pSelect = pExpr->x.pSelect;
        ExprList *pEList = pSelect->pEList;

        assert( !isRowid );
        /* If the LHS and RHS of the IN operator do not match, that
        ** error will have been caught long before we reach this point. */
        if( ALWAYS(pEList->nExpr==nVal) ){
          SelectDest dest;
          int i;
          sqlite3SelectDestInit(&dest, SRT_Set, pExpr->iTable);
          dest.zAffSdst = exprINAffinity(pParse, pExpr);
          pSelect->iLimit = 0;
          testcase( pSelect->selFlags & SF_Distinct );
          testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
          if( sqlite3Select(pParse, pSelect, &dest) ){
            sqlite3DbFree(pParse->db, dest.zAffSdst);
            sqlite3KeyInfoUnref(pKeyInfo);
            return 0;
          }
          sqlite3DbFree(pParse->db, dest.zAffSdst);
          assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
          assert( pEList!=0 );
          assert( pEList->nExpr>0 );
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          for(i=0; i<nVal; i++){
            Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
            pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
                pParse, p, pEList->a[i].pExpr
            );
          }
        }
      }else if( ALWAYS(pExpr->x.pList!=0) ){
        /* Case 2:     expr IN (exprlist)
        **
        ** For each expression, build an index key from the evaluation and
        ** store it in the temporary table. If <expr> is a column, then use
        ** that columns affinity when building index keys. If <expr> is not
        ** a column, use numeric affinity.
        */
        char affinity;            /* Affinity of the LHS of the IN */
        int i;
        ExprList *pList = pExpr->x.pList;
        struct ExprList_item *pItem;
        int r1, r2, r3;

        affinity = sqlite3ExprAffinity(pLeft);
        if( !affinity ){
          affinity = SQLITE_AFF_BLOB;
        }
        if( pKeyInfo ){
          assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
          pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
        }

        /* Loop through each expression in <exprlist>. */
        r1 = sqlite3GetTempReg(pParse);
        r2 = sqlite3GetTempReg(pParse);
        if( isRowid ) sqlite3VdbeAddOp2(v, OP_Null, 0, r2);
        for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
          Expr *pE2 = pItem->pExpr;
          int iValToIns;

          /* If the expression is not constant then we will need to
          ** disable the test that was generated above that makes sure
          ** this code only executes once.  Because for a non-constant
          ** expression we need to rerun this code each time.
          */
          if( jmpIfDynamic>=0 && !sqlite3ExprIsConstant(pE2) ){
            sqlite3VdbeChangeToNoop(v, jmpIfDynamic);
            jmpIfDynamic = -1;
          }

          /* Evaluate the expression and insert it into the temp table */
          if( isRowid && sqlite3ExprIsInteger(pE2, &iValToIns) ){
            sqlite3VdbeAddOp3(v, OP_InsertInt, pExpr->iTable, r2, iValToIns);
          }else{
            r3 = sqlite3ExprCodeTarget(pParse, pE2, r1);
            if( isRowid ){
              sqlite3VdbeAddOp2(v, OP_MustBeInt, r3,
                                sqlite3VdbeCurrentAddr(v)+2);
              VdbeCoverage(v);
              sqlite3VdbeAddOp3(v, OP_Insert, pExpr->iTable, r2, r3);
            }else{
              sqlite3VdbeAddOp4(v, OP_MakeRecord, r3, 1, r2, &affinity, 1);
              sqlite3ExprCacheAffinityChange(pParse, r3, 1);
              sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pExpr->iTable, r2, r3, 1);
            }
          }
        }
        sqlite3ReleaseTempReg(pParse, r1);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      if( pKeyInfo ){
        sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
      }
      break;
    }

    case TK_EXISTS:
    case TK_SELECT:
    default: {
      /* Case 3:    (SELECT ... FROM ...)
      **     or:    EXISTS(SELECT ... FROM ...)
      **
      ** For a SELECT, generate code to put the values for all columns of
      ** the first row into an array of registers and return the index of
      ** the first register.
      **
      ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
      ** into a register and return that register number.
      **
      ** In both cases, the query is augmented with "LIMIT 1".  Any 
      ** preexisting limit is discarded in place of the new LIMIT 1.
      */
      Select *pSel;                         /* SELECT statement to encode */
      SelectDest dest;                      /* How to deal with SELECT result */
      int nReg;                             /* Registers to allocate */

      testcase( pExpr->op==TK_EXISTS );
      testcase( pExpr->op==TK_SELECT );
      assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );

      pSel = pExpr->x.pSelect;
      nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
      sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
      pParse->nMem += nReg;
      if( pExpr->op==TK_SELECT ){
        dest.eDest = SRT_Mem;
        dest.iSdst = dest.iSDParm;
        dest.nSdst = nReg;
        sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
        VdbeComment((v, "Init subquery result"));
      }else{
        dest.eDest = SRT_Exists;
        sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
        VdbeComment((v, "Init EXISTS result"));
      }
      sqlite3ExprDelete(pParse->db, pSel->pLimit);
      pSel->pLimit = sqlite3ExprAlloc(pParse->db, TK_INTEGER,
                                  &sqlite3IntTokens[1], 0);
      pSel->iLimit = 0;
      pSel->selFlags &= ~SF_MultiValue;
      if( sqlite3Select(pParse, pSel, &dest) ){
        return 0;
      }
      rReg = dest.iSDParm;
      ExprSetVVAProperty(pExpr, EP_NoReduce);
      break;
    }
  }

  if( rHasNullFlag ){
    sqlite3SetHasNullFlag(v, pExpr->iTable, rHasNullFlag);
  }

  if( jmpIfDynamic>=0 ){
    sqlite3VdbeJumpHere(v, jmpIfDynamic);
  }
  sqlite3ExprCachePop(pParse);

  return rReg;
}